

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void av1_find_best_ref_mvs
               (int allow_hp,int_mv *mvlist,int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    lower_mv_precision((MV *)((long)mvlist + lVar1),allow_hp,is_integer);
  }
  *nearest_mv = *mvlist;
  *near_mv = mvlist[1];
  return;
}

Assistant:

void av1_find_best_ref_mvs(int allow_hp, int_mv *mvlist, int_mv *nearest_mv,
                           int_mv *near_mv, int is_integer) {
  int i;
  // Make sure all the candidates are properly clamped etc
  for (i = 0; i < MAX_MV_REF_CANDIDATES; ++i) {
    lower_mv_precision(&mvlist[i].as_mv, allow_hp, is_integer);
  }
  *nearest_mv = mvlist[0];
  *near_mv = mvlist[1];
}